

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

void __thiscall
duckdb::DBConfig::ResetOption(DBConfig *this,DatabaseInstance *db,ConfigurationOption *option)

{
  int iVar1;
  InternalException *this_00;
  string local_48;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  if (option->reset_global != (reset_global_function_t)0x0) {
    (*option->reset_global)(db,this);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Could not reset option \"%s\" as a global option","");
  InternalException::InternalException<char_const*>(this_00,&local_48,option->name);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DBConfig::ResetOption(DatabaseInstance *db, const ConfigurationOption &option) {
	lock_guard<mutex> l(config_lock);
	if (!option.reset_global) {
		throw InternalException("Could not reset option \"%s\" as a global option", option.name);
	}
	D_ASSERT(option.set_global);
	option.reset_global(db, *this);
}